

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O2

float __thiscall ConvexDecomposition::CTri::planeDistance(CTri *this,Vector3d *p)

{
  undefined1 auVar1 [16];
  
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)((this->mNormal).y * p->y)),ZEXT416((uint)p->x),
                           ZEXT416((uint)(this->mNormal).x));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)p->z),ZEXT416((uint)(this->mNormal).z));
  return auVar1._0_4_ + this->mPlaneD;
}

Assistant:

float planeDistance(const Vector3d &p) const
  {
		float plane[4];

    plane[0] = mNormal.x;
    plane[1] = mNormal.y;
    plane[2] = mNormal.z;
    plane[3] = mPlaneD;

		return DistToPt( p.Ptr(), plane );

  }